

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O0

void __thiscall xray_re::xr_bone::load_data(xr_bone *this,xr_reader *r)

{
  uint32_t uVar1;
  size_t sVar2;
  float fVar3;
  xr_reader *r_local;
  xr_bone *this_local;
  
  sVar2 = xr_reader::find_chunk(r,2,(bool *)0x0,false);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                  ,0x40,"void xray_re::xr_bone::load_data(xr_reader &)");
  }
  xr_reader::r_sz(r,&this->m_name);
  xr_reader::debug_find_chunk(r);
  sVar2 = xr_reader::find_chunk(r,4);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                  ,0x45,"void xray_re::xr_bone::load_data(xr_reader &)");
  }
  xr_reader::r_sz(r,&this->m_gamemtl);
  xr_reader::debug_find_chunk(r);
  sVar2 = xr_reader::find_chunk(r,5);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                  ,0x4a,"void xray_re::xr_bone::load_data(xr_reader &)");
  }
  xr_reader::r<xray_re::s_bone_shape>(r,&this->m_shape);
  xr_reader::debug_find_chunk(r);
  sVar2 = xr_reader::find_chunk(r,8);
  if (sVar2 != 0) {
    uVar1 = xr_reader::r_u32(r);
    (this->m_joint_ik_data).ik_flags = uVar1;
    xr_reader::debug_find_chunk(r);
  }
  sVar2 = xr_reader::find_chunk(r,6);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                  ,0x54,"void xray_re::xr_bone::load_data(xr_reader &)");
  }
  uVar1 = xr_reader::r_u32(r);
  (this->m_joint_ik_data).type = uVar1;
  xr_reader::r_cseq<xray_re::s_joint_limit>(r,3,(this->m_joint_ik_data).limits);
  fVar3 = xr_reader::r_float(r);
  (this->m_joint_ik_data).spring_factor = fVar3;
  fVar3 = xr_reader::r_float(r);
  (this->m_joint_ik_data).damping_factor = fVar3;
  xr_reader::debug_find_chunk(r);
  sVar2 = xr_reader::find_chunk(r,9);
  if (sVar2 != 0) {
    fVar3 = xr_reader::r_float(r);
    (this->m_joint_ik_data).break_force = fVar3;
    fVar3 = xr_reader::r_float(r);
    (this->m_joint_ik_data).break_torque = fVar3;
    xr_reader::debug_find_chunk(r);
  }
  sVar2 = xr_reader::find_chunk(r,0x10);
  if (sVar2 != 0) {
    fVar3 = xr_reader::r_float(r);
    (this->m_joint_ik_data).friction = fVar3;
    xr_reader::debug_find_chunk(r);
  }
  sVar2 = xr_reader::find_chunk(r,7);
  if (sVar2 != 0) {
    fVar3 = xr_reader::r_float(r);
    this->m_mass = fVar3;
    xr_reader::r_fvector3(r,&this->m_center_of_mass);
    xr_reader::debug_find_chunk(r);
  }
  return;
}

Assistant:

void xr_bone::load_data(xr_reader& r)
{
	if (!r.find_chunk(BONE_CHUNK_DEF, 0, false))
		xr_not_expected();
	r.r_sz(m_name);
	r.debug_find_chunk();

	if (!r.find_chunk(BONE_CHUNK_MATERIAL))
		xr_not_expected();
	r.r_sz(m_gamemtl);
	r.debug_find_chunk();

	if (!r.find_chunk(BONE_CHUNK_SHAPE))
		xr_not_expected();
	r.r<s_bone_shape>(m_shape);
	r.debug_find_chunk();

	if (r.find_chunk(BONE_CHUNK_IK_FLAGS)) {
		m_joint_ik_data.ik_flags = r.r_u32();
		r.debug_find_chunk();
	}

	if (!r.find_chunk(BONE_CHUNK_IK_JOINT))
		xr_not_expected();
	m_joint_ik_data.type = r.r_u32();
	r.r_cseq<s_joint_limit>(3, m_joint_ik_data.limits);
	m_joint_ik_data.spring_factor = r.r_float();
	m_joint_ik_data.damping_factor = r.r_float();
	r.debug_find_chunk();

	if (r.find_chunk(BONE_CHUNK_BREAK_PARAMS)) {
		m_joint_ik_data.break_force = r.r_float();
		m_joint_ik_data.break_torque = r.r_float();
		r.debug_find_chunk();
	}

	if (r.find_chunk(BONE_CHUNK_FRICTION)) {
		m_joint_ik_data.friction = r.r_float();
		r.debug_find_chunk();
	}

	if (r.find_chunk(BONE_CHUNK_MASS_PARAMS)) {
		m_mass = r.r_float();
		r.r_fvector3(m_center_of_mass);
		r.debug_find_chunk();
	}
}